

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

void __thiscall duckdb_snappy::SnappySinkAllocator::Flush(SnappySinkAllocator *this,size_t size)

{
  pointer pDVar1;
  ulong uVar2;
  Datablock *block;
  pointer pDVar3;
  long lVar4;
  
  pDVar1 = (this->blocks_).
           super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = 0;
  for (pDVar3 = (this->blocks_).
                super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
                ._M_impl.super__Vector_impl_data._M_start; pDVar3 != pDVar1; pDVar3 = pDVar3 + 1) {
    uVar2 = size - lVar4;
    if (pDVar3->size <= size - lVar4) {
      uVar2 = pDVar3->size;
    }
    (*this->dest_->_vptr_Sink[4])(this->dest_,pDVar3->data,uVar2,Deleter,0);
    lVar4 = lVar4 + uVar2;
  }
  pDVar3 = (this->blocks_).
           super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->blocks_).
      super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
      ._M_impl.super__Vector_impl_data._M_finish != pDVar3) {
    (this->blocks_).
    super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
    ._M_impl.super__Vector_impl_data._M_finish = pDVar3;
  }
  return;
}

Assistant:

void Flush(size_t size) {
    size_t size_written = 0;
    for (Datablock& block : blocks_) {
      size_t block_size = std::min<size_t>(block.size, size - size_written);
      dest_->AppendAndTakeOwnership(block.data, block_size,
                                    &SnappySinkAllocator::Deleter, NULL);
      size_written += block_size;
    }
    blocks_.clear();
  }